

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

uint baryonyx::itm::get_thread_number(context *ctx)

{
  int iVar1;
  
  iVar1 = (ctx->parameters).thread;
  if (iVar1 < 1) {
    iVar1 = std::thread::hardware_concurrency();
  }
  return iVar1 + (uint)(iVar1 == 0);
}

Assistant:

inline unsigned
get_thread_number(const baryonyx::context& ctx) noexcept
{
    unsigned ret;

    if (ctx.parameters.thread <= 0)
        ret = std::thread::hardware_concurrency();
    else
        ret = static_cast<unsigned>(ctx.parameters.thread);

    if (ret == 0)
        return 1;

    return ret;
}